

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

void print_pcir(envy_bios *bios,FILE *out)

{
  FILE *in_RSI;
  long in_RDI;
  int i;
  uint in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  undefined4 in_stack_ffffffffffffffe8;
  uint uVar1;
  
  fprintf(in_RSI,"BIOS size 0x%x [orig: 0x%x], %d valid parts:\n",(ulong)*(uint *)(in_RDI + 8),
          (ulong)*(uint *)(in_RDI + 0xc),(ulong)*(uint *)(in_RDI + 0x18));
  for (uVar1 = 0; (int)uVar1 < *(int *)(in_RDI + 0x18); uVar1 = uVar1 + 1) {
    fprintf(in_RSI,"\n");
    if (*(char *)(*(long *)(in_RDI + 0x10) + (long)(int)uVar1 * 0x24 + 0x1a) == '\0') {
      fprintf(in_RSI,"BIOS part %d at 0x%x size 0x%x [init: 0x%x]. Sig:\n",(ulong)uVar1,
              (ulong)*(uint *)(*(long *)(in_RDI + 0x10) + (long)(int)uVar1 * 0x24),
              (ulong)*(uint *)(*(long *)(in_RDI + 0x10) + (long)(int)uVar1 * 0x24 + 4),
              (ulong)*(uint *)(*(long *)(in_RDI + 0x10) + (long)(int)uVar1 * 0x24 + 0x1c));
      envy_bios_dump_hex((envy_bios *)in_RSI,(FILE *)CONCAT44(uVar1,in_stack_ffffffffffffffe8),
                         in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
      if (*(int *)(*(long *)(in_RDI + 0x10) + (long)(int)uVar1 * 0x24 + 0x20) == 0) {
        fprintf(in_RSI,"WARN: checksum fail\n");
      }
    }
    else {
      fprintf(in_RSI,"BIOS part %d at 0x%x size 0x%x. Sig:\n",(ulong)uVar1,
              (ulong)*(uint *)(*(long *)(in_RDI + 0x10) + (long)(int)uVar1 * 0x24),
              (ulong)*(uint *)(*(long *)(in_RDI + 0x10) + (long)(int)uVar1 * 0x24 + 4));
      envy_bios_dump_hex((envy_bios *)in_RSI,(FILE *)CONCAT44(uVar1,in_stack_ffffffffffffffe8),
                         in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
    }
    fprintf(in_RSI,"PCIR [rev 0x%02x]:\n",
            (ulong)*(byte *)(*(long *)(in_RDI + 0x10) + (long)(int)uVar1 * 0x24 + 0x14));
    envy_bios_dump_hex((envy_bios *)in_RSI,(FILE *)CONCAT44(uVar1,in_stack_ffffffffffffffe8),
                       in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0);
    fprintf(in_RSI,"PCI device: %04x:%04x, class %02x%02x%02x\n",
            (ulong)*(ushort *)(*(long *)(in_RDI + 0x10) + (long)(int)uVar1 * 0x24 + 0xc),
            (ulong)*(ushort *)(*(long *)(in_RDI + 0x10) + (long)(int)uVar1 * 0x24 + 0xe),
            (ulong)*(byte *)(*(long *)(in_RDI + 0x10) + (long)(int)uVar1 * 0x24 + 0x17),
            (ulong)*(byte *)(*(long *)(in_RDI + 0x10) + (long)(int)uVar1 * 0x24 + 0x16),
            (uint)*(byte *)(*(long *)(in_RDI + 0x10) + (long)(int)uVar1 * 0x24 + 0x15));
    if (*(short *)(*(long *)(in_RDI + 0x10) + (long)(int)uVar1 * 0x24 + 0x10) != 0) {
      fprintf(in_RSI,"VPD: %x\n",
              (ulong)*(ushort *)(*(long *)(in_RDI + 0x10) + (long)(int)uVar1 * 0x24 + 0x10));
    }
    fprintf(in_RSI,"Code type 0x%02x, rev 0x%04x\n",
            (ulong)*(byte *)(*(long *)(in_RDI + 0x10) + (long)(int)uVar1 * 0x24 + 0x1a),
            (ulong)*(ushort *)(*(long *)(in_RDI + 0x10) + (long)(int)uVar1 * 0x24 + 0x18));
    fprintf(in_RSI,"PCIR indicator: %02x\n",
            (ulong)*(byte *)(*(long *)(in_RDI + 0x10) + (long)(int)uVar1 * 0x24 + 0x1b));
  }
  if (*(int *)(in_RDI + 0x1c) != 0) {
    fprintf(in_RSI,"\nWARN: Couldn\'t read part %d!\n",(ulong)*(uint *)(in_RDI + 0x18));
  }
  fprintf(in_RSI,"\n");
  return;
}

Assistant:

static void print_pcir(struct envy_bios *bios, FILE *out) {
	int i;
	fprintf(out, "BIOS size 0x%x [orig: 0x%x], %d valid parts:\n", bios->length, bios->origlength, bios->partsnum);
	for (i = 0; i < bios->partsnum; i++) {
		fprintf(out, "\n");
		if (bios->parts[i].pcir_code_type == 0) {
			fprintf(out, "BIOS part %d at 0x%x size 0x%x [init: 0x%x]. Sig:\n", i, bios->parts[i].start, bios->parts[i].length, bios->parts[i].init_length);
			envy_bios_dump_hex(bios, out, bios->parts[i].start, 3);
			if (!bios->parts[i].chksum_pass)
				fprintf(out, "WARN: checksum fail\n");
		} else {
			fprintf(out, "BIOS part %d at 0x%x size 0x%x. Sig:\n", i, bios->parts[i].start, bios->parts[i].length);
			envy_bios_dump_hex(bios, out, bios->parts[i].start, 2);
		}
		fprintf(out, "PCIR [rev 0x%02x]:\n", bios->parts[i].pcir_rev);
		envy_bios_dump_hex(bios, out, bios->parts[i].start + bios->parts[i].pcir_offset, bios->parts[i].pcir_len);
		fprintf(out, "PCI device: %04x:%04x, class %02x%02x%02x\n", bios->parts[i].pcir_vendor, bios->parts[i].pcir_device, bios->parts[i].pcir_class[2], bios->parts[i].pcir_class[1], bios->parts[i].pcir_class[0]);
		if (bios->parts[i].pcir_vpd)
			fprintf(out, "VPD: %x\n", bios->parts[i].pcir_vpd);
		fprintf(out, "Code type 0x%02x, rev 0x%04x\n", bios->parts[i].pcir_code_type, bios->parts[i].pcir_code_rev);
		fprintf(out, "PCIR indicator: %02x\n", bios->parts[i].pcir_indi);
	}
	if (bios->broken_part)
		fprintf(out, "\nWARN: Couldn't read part %d!\n", bios->partsnum);
	fprintf(out, "\n");
}